

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_wrapper.cpp
# Opt level: O0

void __thiscall daw::curl_wrapper::set_body(curl_wrapper *this,string_view value)

{
  pointer piVar1;
  const_pointer pvVar2;
  curl_wrapper *this_local;
  string_view value_local;
  
  value_local._M_len = (size_t)value._M_str;
  this_local = (curl_wrapper *)value._M_len;
  std::unique_ptr<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>::
  operator->(&this->m_impl);
  std::__cxx11::string::clear();
  piVar1 = std::
           unique_ptr<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>::
           operator->(&this->m_impl);
  pvVar2 = std::data<std::basic_string_view<char,std::char_traits<char>>>
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  std::size<std::basic_string_view<char,std::char_traits<char>>>
            ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  std::__cxx11::string::assign((char *)&piVar1->body,(ulong)pvVar2);
  piVar1 = std::
           unique_ptr<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>::
           operator->(&this->m_impl);
  piVar1->has_body = true;
  return;
}

Assistant:

void curl_wrapper::set_body( std::string_view value ) {
		m_impl->body.clear( );
		m_impl->body.assign( std::data( value ), std::size( value ) );
		m_impl->has_body = true;
	}